

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O1

UModelIndex * __thiscall
TreeModel::addItem(UModelIndex *__return_storage_ptr__,TreeModel *this,UINT32 offset,UINT8 type,
                  UINT8 subtype,CBString *name,CBString *text,CBString *info,UByteArray *header,
                  UByteArray *body,UByteArray *tail,ItemFixedState fixed,UModelIndex *parent,
                  UINT8 mode)

{
  size_t *psVar1;
  undefined1 compressed;
  int iVar2;
  TreeItem *this_00;
  _List_node_base *p_Var3;
  TreeItem *parent_00;
  TreeItem *local_68;
  int local_60;
  UModelIndex local_48;
  
  if (((parent->r < 0) || (local_60 = parent->c, local_60 < 0)) || (parent->m == (TreeModel *)0x0))
  {
    local_60 = 0;
    parent_00 = this->rootItem;
LAB_001484c4:
    local_68 = (TreeItem *)0x0;
  }
  else {
    local_68 = (TreeItem *)parent->i;
    parent_00 = local_68;
    if ((mode & 0xfe) != 2) goto LAB_001484c4;
    parent_00 = local_68->parentItem;
    if (parent->m == (TreeModel *)0x0) {
      local_48.r = -1;
      local_48.c = -1;
      local_48.i = 0;
      local_48.m = (TreeModel *)0x0;
    }
    else {
      TreeModel::parent(&local_48,parent->m,parent);
    }
    local_60 = local_48.c;
  }
  this_00 = (TreeItem *)operator_new(0x118);
  compressed = false;
  if (((-1 < parent->r) && (compressed = false, -1 < parent->c)) && (parent->m != (TreeModel *)0x0))
  {
    compressed = *(undefined1 *)(parent->i + 0xc9);
  }
  TreeItem::TreeItem(this_00,offset,type,subtype,name,text,info,header,body,tail,false,
                     (bool)compressed,parent_00);
  switch(mode) {
  case '\0':
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)this_00;
    break;
  case '\x01':
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)this_00;
    break;
  case '\x02':
    TreeItem::insertChildBefore(parent_00,local_68,this_00);
    goto LAB_001485df;
  case '\x03':
    TreeItem::insertChildAfter(parent_00,local_68,this_00);
    goto LAB_001485df;
  default:
    TreeItem::~TreeItem(this_00);
    operator_delete(this_00);
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    __return_storage_ptr__->i = 0;
    __return_storage_ptr__->m = (TreeModel *)0x0;
    return __return_storage_ptr__;
  }
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(parent_00->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
LAB_001485df:
  iVar2 = TreeItem::row(this_00);
  __return_storage_ptr__->r = iVar2;
  __return_storage_ptr__->c = local_60;
  __return_storage_ptr__->i = (uint64_t)this_00;
  __return_storage_ptr__->m = this;
  setFixed(this,__return_storage_ptr__,fixed != Movable);
  return __return_storage_ptr__;
}

Assistant:

UModelIndex TreeModel::addItem(const UINT32 offset, const UINT8 type, const UINT8 subtype,
                               const UString & name, const UString & text, const UString & info,
                               const UByteArray & header, const UByteArray & body, const UByteArray & tail,
                               const ItemFixedState fixed,
                               const UModelIndex & parent, const UINT8 mode)
{
    TreeItem *item = 0;
    TreeItem *parentItem = 0;
    int parentColumn = 0;
    
    if (!parent.isValid())
        parentItem = rootItem;
    else
    {
        if (mode == CREATE_MODE_BEFORE || mode == CREATE_MODE_AFTER) {
            item = static_cast<TreeItem*>(parent.internalPointer());
            parentItem = item->parent();
            parentColumn = parent.parent().column();
        }
        else {
            parentItem = static_cast<TreeItem*>(parent.internalPointer());
            parentColumn = parent.column();
        }
    }
    
    TreeItem *newItem = new TreeItem(offset, type, subtype, name, text, info, header, body, tail, Movable, this->compressed(parent), parentItem);
    
    if (mode == CREATE_MODE_APPEND) {
        emit layoutAboutToBeChanged();
        parentItem->appendChild(newItem);
    }
    else if (mode == CREATE_MODE_PREPEND) {
        emit layoutAboutToBeChanged();
        parentItem->prependChild(newItem);
    }
    else if (mode == CREATE_MODE_BEFORE) {
        emit layoutAboutToBeChanged();
        parentItem->insertChildBefore(item, newItem);
    }
    else if (mode == CREATE_MODE_AFTER) {
        emit layoutAboutToBeChanged();
        parentItem->insertChildAfter(item, newItem);
    }
    else {
        delete newItem;
        return UModelIndex();
    }
    
    emit layoutChanged();
    
    UModelIndex created = createIndex(newItem->row(), parentColumn, newItem);
    setFixed(created, (bool)fixed); // Non-trivial logic requires additional call
    return created;
}